

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

Result * __thiscall
httplib::ClientImpl::send_with_content_provider
          (Result *__return_storage_ptr__,ClientImpl *this,string *method,string *path,
          Headers *headers,char *body,size_t content_length,ContentProvider content_provider,
          ContentProviderWithoutLength content_provider_without_length,string *content_type)

{
  _Rb_tree_header *p_Var1;
  code *pcVar2;
  _Rep_type *p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_color _Var5;
  _Base_ptr p_Var6;
  Error error;
  unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> res;
  string local_2e8;
  _Any_data local_2c8;
  code *local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  ClientImpl *local_2a0;
  SSL *local_298;
  Request req;
  
  req.method._M_dataplus._M_p = (pointer)&req.method.field_2;
  req.method._M_string_length = 0;
  req.method.field_2._M_local_buf[0] = '\0';
  req.path._M_dataplus._M_p = (pointer)&req.path.field_2;
  req.path._M_string_length = 0;
  req.path.field_2._M_local_buf[0] = '\0';
  req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &req.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  req.body._M_dataplus._M_p = (pointer)&req.body.field_2;
  req.body._M_string_length = 0;
  req.body.field_2._M_local_buf[0] = '\0';
  req.remote_addr._M_dataplus._M_p = (pointer)&req.remote_addr.field_2;
  req.remote_addr._M_string_length = 0;
  req.remote_addr.field_2._M_local_buf[0] = '\0';
  req.remote_port = -1;
  req.local_addr._M_dataplus._M_p = (pointer)&req.local_addr.field_2;
  req.local_addr._M_string_length = 0;
  req.local_addr.field_2._M_local_buf[0] = '\0';
  req.local_port = -1;
  req.version._M_dataplus._M_p = (pointer)&req.version.field_2;
  req.version._M_string_length = 0;
  req.version.field_2._M_local_buf[0] = '\0';
  req.target._M_dataplus._M_p = (pointer)&req.target.field_2;
  req.target._M_string_length = 0;
  req.target.field_2._M_local_buf[0] = '\0';
  req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &req.params._M_t._M_impl.super__Rb_tree_header._M_header;
  req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  req.params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &req.files._M_t._M_impl.super__Rb_tree_header._M_header;
  req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a0 = this;
  local_298 = (SSL *)body;
  req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       req.params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       req.files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  memset(&req.files._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xa8);
  req.redirect_count_ = 0x14;
  req.authorization_count_ = 0;
  req.content_length_ = 0;
  req.content_provider_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  req.content_provider_.super__Function_base._M_functor._8_8_ = 0;
  req.content_provider_.super__Function_base._M_manager._0_1_ = 0;
  req.content_provider_.super__Function_base._M_manager._1_7_ = 0;
  req.content_provider_._M_invoker._0_1_ = 0;
  req._585_8_ = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&req.method,method);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&req.headers._M_t,&headers->_M_t);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&req.path,path);
  local_2c8._M_unused._M_object = (void *)0x0;
  local_2c8._8_8_ = (pointer)0x0;
  local_2b8 = (code *)0x0;
  local_2b0._M_allocated_capacity =
       *(undefined8 *)
        (content_provider.super__Function_base._M_functor._M_unused._M_function_pointer + 0x18);
  pcVar2 = *(code **)(content_provider.super__Function_base._M_functor._M_unused._M_function_pointer
                     + 0x10);
  if (pcVar2 != (code *)0x0) {
    local_2c8._M_unused._0_8_ =
         (undefined8)*content_provider.super__Function_base._M_functor._M_unused._M_object;
    local_2c8._8_8_ =
         *(undefined8 *)
          (content_provider.super__Function_base._M_functor._M_unused._M_function_pointer + 8);
    *(undefined8 *)
     (content_provider.super__Function_base._M_functor._M_unused._M_function_pointer + 0x10) = 0;
    *(undefined8 *)
     (content_provider.super__Function_base._M_functor._M_unused._M_function_pointer + 0x18) = 0;
    local_2b8 = pcVar2;
  }
  local_2e8._M_dataplus._M_p = (pointer)0x0;
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_allocated_capacity = 0;
  local_2e8.field_2._8_8_ =
       *(undefined8 *)(content_provider.super__Function_base._M_functor._8_8_ + 0x18);
  pcVar2 = *(code **)(content_provider.super__Function_base._M_functor._8_8_ + 0x10);
  if (pcVar2 != (code *)0x0) {
    local_2e8._M_dataplus._M_p = *(pointer *)content_provider.super__Function_base._M_functor._8_8_;
    local_2e8._M_string_length =
         *(size_type *)(content_provider.super__Function_base._M_functor._8_8_ + 8);
    *(undefined8 *)(content_provider.super__Function_base._M_functor._8_8_ + 0x10) = 0;
    *(undefined8 *)(content_provider.super__Function_base._M_functor._8_8_ + 0x18) = 0;
    local_2e8.field_2._M_allocated_capacity = (size_type)pcVar2;
  }
  send_with_content_provider
            ((ClientImpl *)&res,(Request *)local_2a0,(char *)&req,(size_t)local_298,
             (ContentProvider *)content_length,(ContentProviderWithoutLength *)&local_2c8,&local_2e8
             ,(Error *)content_provider.super__Function_base._M_manager);
  if ((code *)local_2e8.field_2._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_2e8.field_2._M_allocated_capacity)(&local_2e8,&local_2e8,3);
  }
  if (local_2b8 != (code *)0x0) {
    (*local_2b8)(&local_2c8,&local_2c8,__destroy_functor);
  }
  (__return_storage_ptr__->res_)._M_t.
  super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (Response *)
       res._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>.
       _M_t.super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
       super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl;
  res._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0;
  __return_storage_ptr__->err_ = Success;
  p_Var4 = &(__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    p_Var3 = &(__return_storage_ptr__->request_headers_)._M_t;
    _Var5 = _S_red;
    p_Var6 = p_Var4;
  }
  else {
    p_Var3 = &req.headers._M_t;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    (req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var4;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         req.headers._M_t._M_impl.super__Rb_tree_header._M_node_count;
    req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var1 = &req.headers._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    _Var5 = req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    req.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       p_Var4;
  (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       p_Var6;
  (((_Rep_type *)&p_Var3->_M_impl)->_M_impl).super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _Var5;
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr(&res);
  Request::~Request(&req);
  return __return_storage_ptr__;
}

Assistant:

inline Result ClientImpl::send_with_content_provider(
    const std::string &method, const std::string &path, const Headers &headers,
    const char *body, size_t content_length, ContentProvider content_provider,
    ContentProviderWithoutLength content_provider_without_length,
    const std::string &content_type) {
  Request req;
  req.method = method;
  req.headers = headers;
  req.path = path;

  auto error = Error::Success;

  auto res = send_with_content_provider(
      req, body, content_length, std::move(content_provider),
      std::move(content_provider_without_length), content_type, error);

  return Result{std::move(res), error, std::move(req.headers)};
}